

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QEventPoint>::emplace<QEventPoint_const&>
          (QMovableArrayOps<QEventPoint> *this,qsizetype i,QEventPoint *args)

{
  QEventPoint **ppQVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_58;
  QEventPoint tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QEventPoint>).super_QArrayDataPointer<QEventPoint>.d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QEventPoint>).super_QArrayDataPointer<QEventPoint>.size == i)
    {
      qVar5 = QArrayDataPointer<QEventPoint>::freeSpaceAtEnd((QArrayDataPointer<QEventPoint> *)this)
      ;
      if (qVar5 == 0) goto LAB_002a4f2c;
      QEventPoint::QEventPoint
                ((this->super_QGenericArrayOps<QEventPoint>).super_QArrayDataPointer<QEventPoint>.
                 ptr + (this->super_QGenericArrayOps<QEventPoint>).
                       super_QArrayDataPointer<QEventPoint>.size,args);
LAB_002a5019:
      pqVar2 = &(this->super_QGenericArrayOps<QEventPoint>).super_QArrayDataPointer<QEventPoint>.
                size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_002a4fd8;
    }
LAB_002a4f2c:
    if (i == 0) {
      qVar5 = QArrayDataPointer<QEventPoint>::freeSpaceAtBegin
                        ((QArrayDataPointer<QEventPoint> *)this);
      if (qVar5 != 0) {
        QEventPoint::QEventPoint
                  ((this->super_QGenericArrayOps<QEventPoint>).super_QArrayDataPointer<QEventPoint>.
                   ptr + -1,args);
        ppQVar1 = &(this->super_QGenericArrayOps<QEventPoint>).super_QArrayDataPointer<QEventPoint>.
                   ptr;
        *ppQVar1 = *ppQVar1 + -1;
        goto LAB_002a5019;
      }
    }
  }
  tmp.d.d.ptr = (QExplicitlySharedDataPointer<QEventPointPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QEventPoint::QEventPoint(&tmp,args);
  bVar6 = (this->super_QGenericArrayOps<QEventPoint>).super_QArrayDataPointer<QEventPoint>.size != 0
  ;
  QArrayDataPointer<QEventPoint>::detachAndGrow
            ((QArrayDataPointer<QEventPoint> *)this,(uint)(i == 0 && bVar6),1,(QEventPoint **)0x0,
             (QArrayDataPointer<QEventPoint> *)0x0);
  if (i == 0 && bVar6) {
    (this->super_QGenericArrayOps<QEventPoint>).super_QArrayDataPointer<QEventPoint>.ptr[-1].d.d.ptr
         = (QEventPointPrivate *)tmp.d.d.ptr;
    ppQVar1 = &(this->super_QGenericArrayOps<QEventPoint>).super_QArrayDataPointer<QEventPoint>.ptr;
    *ppQVar1 = *ppQVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QEventPoint>).super_QArrayDataPointer<QEventPoint>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_58,(QArrayDataPointer<QEventPoint> *)this,i,1);
    ((local_58.displaceFrom)->d).d.ptr = (QEventPointPrivate *)tmp.d.d.ptr;
    local_58.displaceFrom = local_58.displaceFrom + 1;
    (local_58.data)->size = (local_58.data)->size + local_58.nInserts;
  }
  tmp.d.d.ptr = (QExplicitlySharedDataPointer<QEventPointPrivate>)
                (totally_ordered_wrapper<QEventPointPrivate_*>)0x0;
  QEventPoint::~QEventPoint(&tmp);
LAB_002a4fd8:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }